

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_ssize_t
utf8proc_reencode(utf8proc_int32_t *buffer,utf8proc_ssize_t length,utf8proc_option_t options)

{
  utf8proc_ssize_t uVar1;
  utf8proc_int32_t *puStack_38;
  utf8proc_int32_t uc;
  utf8proc_ssize_t wpos;
  utf8proc_ssize_t rpos;
  utf8proc_option_t options_local;
  utf8proc_ssize_t length_local;
  utf8proc_int32_t *buffer_local;
  
  buffer_local = (utf8proc_int32_t *)utf8proc_normalize_utf32(buffer,length,options);
  if (-1 < (long)buffer_local) {
    puStack_38 = (utf8proc_int32_t *)0x0;
    if ((options & UTF8PROC_CHARBOUND) == 0) {
      for (wpos = 0; wpos < (long)buffer_local; wpos = wpos + 1) {
        uVar1 = utf8proc_encode_char
                          (buffer[wpos],(utf8proc_uint8_t *)((long)buffer + (long)puStack_38));
        puStack_38 = (utf8proc_int32_t *)(uVar1 + (long)puStack_38);
      }
    }
    else {
      for (wpos = 0; wpos < (long)buffer_local; wpos = wpos + 1) {
        uVar1 = unsafe_encode_char(buffer[wpos],
                                   (utf8proc_uint8_t *)((long)buffer + (long)puStack_38));
        puStack_38 = (utf8proc_int32_t *)(uVar1 + (long)puStack_38);
      }
    }
    *(undefined1 *)((long)buffer + (long)puStack_38) = 0;
    buffer_local = puStack_38;
  }
  return (utf8proc_ssize_t)buffer_local;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_reencode(utf8proc_int32_t *buffer, utf8proc_ssize_t length, utf8proc_option_t options) {
  /* UTF8PROC_NULLTERM option will be ignored, 'length' is never ignored
     ASSERT: 'buffer' has one spare byte of free space at the end! */
  length = utf8proc_normalize_utf32(buffer, length, options);
  if (length < 0) return length;
  {
    utf8proc_ssize_t rpos, wpos = 0;
    utf8proc_int32_t uc;
    if (options & UTF8PROC_CHARBOUND) {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += unsafe_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    } else {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += utf8proc_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    }
    ((utf8proc_uint8_t *)buffer)[wpos] = 0;
    return wpos;
  }
}